

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O3

void __thiscall CVmBifTable::clear(CVmBifTable *this)

{
  ushort uVar1;
  ulong uVar2;
  
  if (this->table_ != (vm_bif_entry_t **)0x0) {
    uVar1 = this->count_;
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        if (this->table_[uVar2] != (vm_bif_entry_t *)0x0) {
          (*this->table_[uVar2]->detach)();
          uVar1 = this->count_;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < uVar1);
    }
  }
  if ((this->names_ != (char **)0x0) && (this->count_ != 0)) {
    uVar2 = 0;
    do {
      lib_free_str(this->names_[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->count_);
  }
  this->count_ = 0;
  return;
}

Assistant:

void CVmBifTable::clear(VMG0_)
{
    size_t i;

    /* detach each function set */
    if (table_ != 0)
    {
        for (i = 0 ; i < count_ ; ++i)
        {
            if (table_[i] != 0)
                table_[i]->unload_image(vmg_ i);
        }
    }

    /* delete the 'names' entries, if we allocated any */
    if (names_ != 0)
    {
        /* free each element */
        for (i = 0 ; i < count_ ; ++i)
            lib_free_str(names_[i]);
    }

    /* 
     *   Reset the entry counter.  Note that this doesn't affect any
     *   allocation; we keep a separate count of the number of table slots
     *   we have allocated.  Table slots don't have any additional
     *   associated memory, so we don't need to worry about cleaning
     *   anything up at this point.  
     */
    count_ = 0;
}